

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bidi_test.c
# Opt level: O3

void char_test(char *filename,FILE *fp)

{
  char *pcVar1;
  ulong uVar2;
  uint *order;
  size_t oldlen;
  uint uVar3;
  bidi_char *bcs;
  long lVar4;
  size_t oldlen_00;
  ptrlen pVar5;
  ptrlen pl;
  size_t order_size;
  size_t bcs_size;
  ptrlen local_90;
  int local_80;
  uint local_7c;
  FILE *local_78;
  char *local_70;
  size_t local_68;
  void *local_60;
  ptrlen local_58;
  char *local_48;
  size_t local_40 [2];
  
  order = (uint *)0x0;
  local_40[1] = 0;
  local_40[0] = 0;
  local_70 = filename;
  pcVar1 = fgetline(fp);
  pcVar1 = chomp(pcVar1);
  bcs = (bidi_char *)0x0;
  if (pcVar1 != (char *)0x0) {
    bcs = (bidi_char *)0x0;
    uVar3 = 1;
    order = (uint *)0x0;
    local_78 = fp;
    do {
      if ((*pcVar1 != '\0') && (*pcVar1 != '#')) {
        local_7c = uVar3;
        local_90.len = strlen(pcVar1);
        local_90.ptr = pcVar1;
        local_48 = pcVar1;
        pVar5 = ptrlen_get_word(&local_90,";");
        local_68 = pVar5.len;
        local_60 = pVar5.ptr;
        pVar5 = ptrlen_get_word(&local_90,";");
        ptrlen_get_word(&local_90,";");
        ptrlen_get_word(&local_90,";");
        local_58 = ptrlen_get_word(&local_90,";");
        pcVar1 = mkstr(pVar5);
        uVar2 = strtoul(pcVar1,(char **)0x0,0);
        safefree(pcVar1);
        local_80 = -(uint)((int)uVar2 == 1);
        if ((int)uVar2 == 0) {
          local_80 = 1;
        }
        local_90.ptr = local_60;
        local_90.len = local_68;
        if (local_68 == 0) {
          oldlen = 0;
        }
        else {
          lVar4 = 10;
          oldlen = 0;
          do {
            pVar5 = ptrlen_get_word(&local_90," ");
            pcVar1 = mkstr(pVar5);
            bcs = (bidi_char *)safegrowarray(bcs,local_40 + 1,0xc,oldlen,1,false);
            uVar2 = strtoul(pcVar1,(char **)0x0,0x10);
            *(int *)((long)bcs + lVar4 + -6) = (int)uVar2;
            *(int *)((long)bcs + lVar4 + -10) = (int)uVar2;
            *(short *)((long)bcs + lVar4 + -2) = (short)oldlen;
            *(undefined2 *)((long)&bcs->origwc + lVar4) = 1;
            oldlen = oldlen + 1;
            safefree(pcVar1);
            lVar4 = lVar4 + 0xc;
          } while (local_90.len != 0);
        }
        local_90.ptr = local_58.ptr;
        local_90.len = local_58.len;
        oldlen_00 = 0;
        if (local_58.len != 0) {
          do {
            pVar5 = ptrlen_get_word(&local_90," ");
            pcVar1 = mkstr(pVar5);
            order = (uint *)safegrowarray(order,local_40,4,oldlen_00,1,false);
            uVar2 = strtoul(pcVar1,(char **)0x0,0);
            order[oldlen_00] = (uint)uVar2;
            oldlen_00 = oldlen_00 + 1;
            safefree(pcVar1);
          } while (local_90.len != 0);
        }
        uVar3 = local_7c;
        run_test(local_70,local_7c,bcs,oldlen,order,oldlen_00,local_80);
        fp = local_78;
        pcVar1 = local_48;
      }
      safefree(pcVar1);
      uVar3 = uVar3 + 1;
      pcVar1 = fgetline(fp);
      pcVar1 = chomp(pcVar1);
    } while (pcVar1 != (char *)0x0);
  }
  safefree(bcs);
  safefree(order);
  return;
}

Assistant:

static void char_test(const char *filename, FILE *fp)
{
    unsigned lineno = 0;
    size_t bcs_size = 0, bcs_len = 0;
    bidi_char *bcs = NULL;
    size_t order_size = 0, order_len = 0;
    unsigned *order = NULL;

    while (true) {
        lineno++;
        char *line = chomp(fgetline(fp));
        if (!line)
            break;

        /* Skip blank lines and comments */
        if (!line[0] || line[0] == '#') {
            sfree(line);
            continue;
        }

        /* Break each test line up into its main fields */
        ptrlen input_pl, para_dir_pl, order_pl;
        {
            ptrlen pl = ptrlen_from_asciz(line);
            input_pl = ptrlen_get_word(&pl, ";");
            para_dir_pl = ptrlen_get_word(&pl, ";");
            ptrlen_get_word(&pl, ";"); /* paragraph level, which we ignore */
            ptrlen_get_word(&pl, ";"); /* embedding levels, which we ignore */
            order_pl = ptrlen_get_word(&pl, ";");
        }

        int override;
        {
            char *para_dir_str = mkstr(para_dir_pl);
            unsigned para_dir = strtoul(para_dir_str, NULL, 0);
            sfree(para_dir_str);

            override = (para_dir == 0 ? +1 : para_dir == 1 ? -1 : 0);
        }

        /* Break up the input into Unicode characters */
        bcs_len = 0;
        {
            ptrlen pl = input_pl;
            while (pl.len) {
                ptrlen chr = ptrlen_get_word(&pl, " ");
                char *chrstr = mkstr(chr);
                sgrowarray(bcs, bcs_size, bcs_len);
                bcs[bcs_len].wc = strtoul(chrstr, NULL, 16);
                bcs[bcs_len].origwc = bcs[bcs_len].wc;
                bcs[bcs_len].index = bcs_len;
                bcs[bcs_len].nchars = 1;
                bcs_len++;
                sfree(chrstr);
            }
        }

        /* Ditto the expected output order */
        order_len = 0;
        {
            ptrlen pl = order_pl;
            while (pl.len) {
                ptrlen chr = ptrlen_get_word(&pl, " ");
                char *chrstr = mkstr(chr);
                sgrowarray(order, order_size, order_len);
                order[order_len++] = strtoul(chrstr, NULL, 0);
                sfree(chrstr);
            }
        }

        run_test(filename, lineno, bcs, bcs_len, order, order_len, override);
        sfree(line);
    }

    sfree(bcs);
    sfree(order);
}